

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::Reader::readValue(Reader *this)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  Token *token_00;
  Token token;
  ValueHolder local_48 [2];
  long local_38 [2];
  Token local_28;
  
  token_00 = &local_28;
  skipCommentTokens(this,token_00);
  if ((this->collectComments_ == true) && ((this->commentsBefore_)._M_string_length != 0)) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::setComment(ppVVar2[-1],&this->commentsBefore_,commentBefore);
    token_00 = (Token *)0x0;
    std::__cxx11::string::_M_replace
              ((ulong)&this->commentsBefore_,0,(char *)(this->commentsBefore_)._M_string_length,
               0x17a233);
  }
  switch(local_28.type_) {
  case tokenObjectBegin:
    bVar1 = readObject(this,token_00);
    break;
  default:
    local_48[0].string_ = (char *)local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_48,"Syntax error: value, object or array expected.","");
    addError(this,(string *)local_48,&local_28,(Location)0x0);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0].string_,local_38[0] + 1);
    }
    return false;
  case tokenArrayBegin:
    bVar1 = readArray(this,token_00);
    break;
  case tokenString:
    bVar1 = decodeString(this,&local_28);
    break;
  case tokenNumber:
    bVar1 = decodeNumber(this,&local_28);
    break;
  case tokenTrue:
    Value::Value((Value *)local_48,true);
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::operator=(ppVVar2[-1],(Value *)local_48);
    goto LAB_0013cc0b;
  case tokenFalse:
    Value::Value((Value *)local_48,false);
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::operator=(ppVVar2[-1],(Value *)local_48);
    goto LAB_0013cc0b;
  case tokenNull:
    Value::Value((Value *)local_48,nullValue);
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::operator=(ppVVar2[-1],(Value *)local_48);
LAB_0013cc0b:
    Value::~Value((Value *)local_48);
    bVar1 = true;
  }
  if (this->collectComments_ == true) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    this->lastValueEnd_ = this->current_;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->lastValue_ = ppVVar2[-1];
  }
  return bVar1;
}

Assistant:

bool
Reader::readValue()
{
   Token token;
   skipCommentTokens( token );
   bool successful = true;

   if ( collectComments_  &&  !commentsBefore_.empty() )
   {
      currentValue().setComment( commentsBefore_, commentBefore );
      commentsBefore_ = "";
   }


   switch ( token.type_ )
   {
   case tokenObjectBegin:
      successful = readObject( token );
      break;
   case tokenArrayBegin:
      successful = readArray( token );
      break;
   case tokenNumber:
      successful = decodeNumber( token );
      break;
   case tokenString:
      successful = decodeString( token );
      break;
   case tokenTrue:
      currentValue() = true;
      break;
   case tokenFalse:
      currentValue() = false;
      break;
   case tokenNull:
      currentValue() = Value();
      break;
   default:
      return addError( "Syntax error: value, object or array expected.", token );
   }

   if ( collectComments_ )
   {
      lastValueEnd_ = current_;
      lastValue_ = &currentValue();
   }

   return successful;
}